

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLOutput.cpp
# Opt level: O1

void __thiscall
Test::HTMLOutput::generate(HTMLOutput *this,ostream *stream,bool includePassed,string *title)

{
  char cVar1;
  SuiteInfo *suite;
  
  generateHeader(this,stream,title);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<body>",6);
  generateSuitesTable(this,stream,includePassed);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<br>",4);
  cVar1 = (char)stream;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  suite = *(SuiteInfo **)(this + 8);
  if (suite != *(SuiteInfo **)(this + 0x10)) {
    do {
      if ((includePassed) || (suite->numTests != suite->numPositiveTests)) {
        generateTestsTable(this,stream,suite,false);
        std::__ostream_insert<char,std::char_traits<char>>(stream,"<br>",4);
        std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
      }
      suite = suite + 1;
    } while (suite != *(SuiteInfo **)(this + 0x10));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"</body></html>",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void HTMLOutput::generate(std::ostream &stream, bool includePassed, const std::string &title) {
  // 1. print header (including style-information)
  generateHeader(stream, title);
  stream << "<body>";
  // 2. print table
  generateSuitesTable(stream, includePassed);
  stream << "<br>" << std::endl;
  auto suiteInfo = suites.begin();
  while (suiteInfo != suites.end()) {
    if (includePassed || suiteInfo->numTests != suiteInfo->numPositiveTests) {
      generateTestsTable(stream, *suiteInfo, includePassed);
      stream << "<br>" << std::endl;
    }
    ++suiteInfo;
  }
  stream << "</body></html>" << std::endl;
  // flush all data to the stream
  stream.flush();
}